

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

uint prvTidytmbstrlen(ctmbstr str)

{
  uint local_14;
  ctmbstr ptStack_10;
  uint len;
  ctmbstr str_local;
  
  local_14 = 0;
  ptStack_10 = str;
  if (str != (ctmbstr)0x0) {
    while (*ptStack_10 != '\0') {
      local_14 = local_14 + 1;
      ptStack_10 = ptStack_10 + 1;
    }
  }
  return local_14;
}

Assistant:

uint TY_(tmbstrlen)( ctmbstr str )
{
    uint len = 0;
    if ( str ) 
    {
        while ( *str++ )
            ++len;
    }
    return len;
}